

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITexec.cpp
# Opt level: O3

void pop_register(void)

{
  vm_register *pvVar1;
  uint uVar2;
  
  pvVar1 = registe_ptr;
  registe_ptr->R0 = r0;
  pvVar1->R1 = r1;
  pvVar1->R2 = r2;
  pvVar1->R3 = r3;
  pvVar1->R4 = r4;
  if (jit_type == '\0') {
    uVar2 = pvVar1->CS + code_bin_end;
  }
  else {
    if (jit_type != '\x01') {
      return;
    }
    uVar2 = *(uint *)(stack_ptr + pvVar1->SP);
    pvVar1->SP = pvVar1->SP - 4;
  }
  pvVar1->IP = uVar2;
  return;
}

Assistant:

void pop_register() {
	registe_ptr->R0 = r0;
	registe_ptr->R1 = r1;
	registe_ptr->R2 = r2;
	registe_ptr->R3 = r3;
	registe_ptr->R4 = r4;
	if (jit_type == 1) {
		unsigned re_adr = *(unsigned*)(stack_ptr + registe_ptr->SP);
		registe_ptr->SP -= 4;
		registe_ptr->IP = re_adr;
	}
	else if (jit_type == 0) {
		registe_ptr->IP = code_bin_end + registe_ptr->CS;
	}
}